

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_multi_file_info.cpp
# Opt level: O2

bool duckdb::CSVMultiFileInfo::ParseCopyOption
               (ClientContext *context,string *key,vector<duckdb::Value,_true> *values,
               BaseFileReaderOptions *options_p,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *expected_names,vector<duckdb::LogicalType,_true> *expected_types)

{
  vector<duckdb::Value,_true> local_90;
  string local_78;
  Value local_58;
  
  StringUtil::Lower(&local_78,key);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_90,
             &values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
  ConvertVectorToValue(&local_58,&local_90);
  CSVReaderOptions::SetReadOption
            ((CSVReaderOptions *)(options_p + 1),&local_78,&local_58,expected_names);
  Value::~Value(&local_58);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_78);
  return true;
}

Assistant:

bool CSVMultiFileInfo::ParseCopyOption(ClientContext &context, const string &key, const vector<Value> &values,
                                       BaseFileReaderOptions &options_p, vector<string> &expected_names,
                                       vector<LogicalType> &expected_types) {
	auto &options = options_p.Cast<CSVFileReaderOptions>();
	options.options.SetReadOption(StringUtil::Lower(key), ConvertVectorToValue(values), expected_names);
	return true;
}